

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessor_case.cc
# Opt level: O2

string_view google::protobuf::compiler::rust::ViewReceiver(AccessorCase accessor_case)

{
  string_view sVar1;
  
  if (accessor_case < (VIEW|MUT)) {
    sVar1._M_str = &DAT_003f33d8 + *(int *)(&DAT_003f33d8 + (ulong)accessor_case * 4);
    sVar1._M_len = *(size_t *)(&DAT_003f33e8 + (ulong)accessor_case * 8);
    return sVar1;
  }
  return (string_view)(ZEXT816(0x2af559) << 0x40);
}

Assistant:

absl::string_view ViewReceiver(AccessorCase accessor_case) {
  switch (accessor_case) {
    case AccessorCase::VIEW:
      return "self";
    case AccessorCase::OWNED:
    case AccessorCase::MUT:
      return "&self";
  }
  return "";
}